

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  char *pcVar1;
  long *plVar2;
  unsigned_long uVar3;
  ArrayPtr<char> AVar4;
  long local_e0;
  unsigned_long local_d8 [2];
  bool local_c1;
  long lStack_c0;
  bool _kj_shouldLog_2;
  long local_b8;
  unsigned_long local_b0 [2];
  bool local_99;
  long lStack_98;
  bool _kj_shouldLog_1;
  long local_90;
  unsigned_long local_88 [2];
  bool local_71;
  long lStack_70;
  bool _kj_shouldLog;
  undefined1 local_68 [8];
  ArrayPtr<char> arr;
  char *c2;
  long *l;
  char *c;
  Arena arena;
  TestCase183 *this_local;
  
  arena.currentChunk = (ChunkHeader *)this;
  Arena::Arena((Arena *)&c,0x400);
  pcVar1 = Arena::allocate<char>((Arena *)&c);
  plVar2 = Arena::allocate<long>((Arena *)&c);
  arr.size_ = (size_t)Arena::allocate<char>((Arena *)&c);
  AVar4 = Arena::allocateArray<char>((Arena *)&c,8);
  arr.ptr = (char *)AVar4.size_;
  local_68 = (undefined1  [8])AVar4.ptr;
  lStack_70 = arr.size_ - (long)pcVar1;
  uVar3 = implicitCast<unsigned_long,long>(&stack0xffffffffffffff90);
  if (uVar3 != 0x10) {
    local_71 = _::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      local_88[1] = 0x10;
      local_90 = arr.size_ - (long)pcVar1;
      local_88[0] = implicitCast<unsigned_long,long>(&local_90);
      _::Debug::log<char_const(&)[84],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xbf,ERROR,
                 "\"failed: expected \" \"(alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))\", alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c)"
                 ,(char (*) [84])
                  "failed: expected (alignof(long) + sizeof(long)) == (implicitCast<size_t>(&c2 - &c))"
                 ,local_88 + 1,local_88);
      local_71 = false;
    }
  }
  lStack_98 = (long)plVar2 - (long)pcVar1;
  uVar3 = implicitCast<unsigned_long,long>(&stack0xffffffffffffff68);
  if (uVar3 != 8) {
    local_99 = _::Debug::shouldLog(ERROR);
    while (local_99 != false) {
      local_b0[1] = 8;
      local_b8 = (long)plVar2 - (long)pcVar1;
      local_b0[0] = implicitCast<unsigned_long,long>(&local_b8);
      _::Debug::log<char_const(&)[93],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xc0,ERROR,
                 "\"failed: expected \" \"(alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))\", alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c)"
                 ,(char (*) [93])
                  "failed: expected (alignof(long)) == (implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c))"
                 ,local_b0 + 1,local_b0);
      local_99 = false;
    }
  }
  pcVar1 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_68);
  lStack_c0 = (long)pcVar1 - arr.size_;
  uVar3 = implicitCast<unsigned_long,long>(&stack0xffffffffffffff40);
  if (uVar3 != 1) {
    local_c1 = _::Debug::shouldLog(ERROR);
    while (local_c1 != false) {
      local_d8[1] = 1;
      pcVar1 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_68);
      local_e0 = (long)pcVar1 - arr.size_;
      local_d8[0] = implicitCast<unsigned_long,long>(&local_e0);
      _::Debug::log<char_const(&)[77],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
                 ,0xc1,ERROR,
                 "\"failed: expected \" \"(sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))\", sizeof(char), implicitCast<size_t>(arr.begin() - &c2)"
                 ,(char (*) [77])
                  "failed: expected (sizeof(char)) == (implicitCast<size_t>(arr.begin() - &c2))",
                 local_d8 + 1,local_d8);
      local_c1 = false;
    }
  }
  Arena::~Arena((Arena *)&c);
  return;
}

Assistant:

TEST(Arena, Alignment) {
  Arena arena;

  char& c = arena.allocate<char>();
  long& l = arena.allocate<long>();
  char& c2 = arena.allocate<char>();
  ArrayPtr<char> arr = arena.allocateArray<char>(8);

  EXPECT_EQ(alignof(long) + sizeof(long), implicitCast<size_t>(&c2 - &c));
  EXPECT_EQ(alignof(long), implicitCast<size_t>(reinterpret_cast<char*>(&l) - &c));
  EXPECT_EQ(sizeof(char), implicitCast<size_t>(arr.begin() - &c2));
}